

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_blitter.cpp
# Opt level: O1

void __thiscall
QBlitterPaintEnginePrivate::updateCompleteState(QBlitterPaintEnginePrivate *this,QPainterState *s)

{
  uint uVar1;
  _Head_base<0UL,_QBrushData_*,_false> _Var2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar1 = (this->caps).capabillitiesState;
  uVar4 = (uint)(((s->pen).d.d.ptr)->style != NoPen) << 8;
  (this->caps).capabillitiesState = uVar4 | uVar1 & 0xfffffeff;
  _Var2._M_head_impl =
       (s->brush).d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
  (this->caps).capabillitiesState =
       (uint)((_Var2._M_head_impl)->style != SolidPattern) << 4 | uVar4 | uVar1 & 0xfffffeef;
  iVar3 = QColor::alpha(&(_Var2._M_head_impl)->color);
  uVar1 = (this->caps).capabillitiesState;
  uVar5 = (uint)(iVar3 < 0xff) << 5;
  (this->caps).capabillitiesState = uVar5 | uVar1 & 0xffffffdf;
  uVar4 = (uint)(s->opacity <= 1.0 && s->opacity != 1.0) << 0xd;
  (this->caps).capabillitiesState = uVar4 | uVar5 | uVar1 & 0xffffdfdf;
  uVar6 = (uint)(s->composition_mode != CompositionMode_Source &&
                s->composition_mode != CompositionMode_SourceOver) << 0xe;
  (this->caps).capabillitiesState = uVar6 | uVar4 | uVar5 | uVar1 & 0xffff9fdf;
  (this->caps).capabillitiesState =
       ((s->renderHints).super_QFlagsStorageHelper<QPainter::RenderHint,_4>.
        super_QFlagsStorage<QPainter::RenderHint>.i & 1) << 0xc |
       uVar6 | uVar4 | uVar5 | uVar1 & 0xffff8fdf;
  updateTransformState(this,s);
  updateClipState(this,s);
  return;
}

Assistant:

void QBlitterPaintEnginePrivate::updateCompleteState(QPainterState *s)
{
    updatePenState(s);
    updateBrushState(s);
    updateOpacityState(s);
    updateCompositionModeState(s);
    updateRenderHintsState(s);
    updateTransformState(s);
    updateClipState(s);
}